

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_compiled.hpp
# Opt level: O0

void * __thiscall
randomx::CompiledVm<randomx::AlignedAllocator<64ul>,true,true>::operator_new(size_t size)

{
  bad_alloc *this;
  undefined8 uVar1;
  void *ptr;
  size_t in_stack_fffffffffffffff0;
  
  this = (bad_alloc *)AlignedAllocator<64UL>::allocMemory(in_stack_fffffffffffffff0);
  if (this == (bad_alloc *)0x0) {
    uVar1 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this);
    __cxa_throw(uVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return this;
}

Assistant:

void* operator new(size_t size) {
			void* ptr = AlignedAllocator<CacheLineSize>::allocMemory(size);
			if (ptr == nullptr)
				throw std::bad_alloc();
			return ptr;
		}